

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O1

int __thiscall DataServer::mkdir(DataServer *this,char *__path,__mode_t __mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint __val;
  uint uVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  long *plVar5;
  uint uVar6;
  long *plVar7;
  size_type *psVar8;
  ulong uVar9;
  uint __len;
  string folder;
  string __str;
  path local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar2 = this->serverId;
  __val = -uVar2;
  if (0 < (int)uVar2) {
    __val = uVar2;
  }
  __len = 1;
  if (9 < __val) {
    uVar9 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar6 = (uint)uVar9;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_0011aa0b;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_0011aa0b;
      }
      if (uVar6 < 10000) goto LAB_0011aa0b;
      uVar9 = uVar9 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_0011aa0b:
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,(char)__len - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_50[0] + (uVar2 >> 0x1f),__len,__val);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x133326);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_60 = *plVar7;
    lStack_58 = plVar5[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar7;
    local_70 = (long *)*plVar5;
  }
  local_68 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  paVar1 = &local_b0.m_pathname.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_b0.m_pathname.field_2._M_allocated_capacity = *psVar8;
    local_b0.m_pathname.field_2._8_8_ = plVar5[3];
    local_b0.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b0.m_pathname.field_2._M_allocated_capacity = *psVar8;
    local_b0.m_pathname._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_b0.m_pathname._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)mkdir_path_abi_cxx11_._M_dataplus._M_p);
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_80 = *plVar7;
    lStack_78 = plVar5[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar7;
    local_90 = (long *)*plVar5;
  }
  local_88 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0.m_pathname._M_dataplus._M_p);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  local_b0.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_90,local_88 + (long)local_90);
  iVar4 = boost::filesystem::detail::create_directories(&local_b0,(error_code *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0.m_pathname._M_dataplus._M_p);
    iVar4 = extraout_EAX;
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
    iVar4 = extraout_EAX_00;
  }
  return iVar4;
}

Assistant:

void mkdir() const
    {
        string folder = "dfsfiles/datanode" + to_string(serverId) + "/" + mkdir_path;
        boost::filesystem::create_directories(folder);
    }